

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segdmp.c
# Opt level: O0

int segdmp_next_feat(uint32 id,vector_t ***out_feat,uint32 *out_n_frame)

{
  uint uVar1;
  uint uVar2;
  FILE *__stream;
  int iVar3;
  int32 iVar4;
  ulong uVar5;
  void *buf_00;
  long lVar6;
  vector_t **pppfVar7;
  uint local_54;
  uint local_50;
  uint32 l;
  uint32 j;
  uint32 i;
  vector_t **feat;
  float32 *buf;
  uint32 n_seg_frame;
  uint32 off;
  uint32 s;
  FILE *fp;
  uint32 *out_n_frame_local;
  vector_t ***out_feat_local;
  uint32 id_local;
  
  __stream = (FILE *)dmp_fp[id_part[id]];
  uVar1 = nxt_seg[id];
  if (uVar1 == n_seg[id]) {
    nxt_seg[id] = 0;
    out_feat_local._4_4_ = 0;
  }
  else {
    nxt_seg[id] = nxt_seg[id] + 1;
    uVar2 = id_nxt_off[id];
    uVar5 = ftell(__stream);
    if ((uVar5 != uVar2) && (iVar3 = fseek(__stream,(ulong)uVar2,0), iVar3 < 0)) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                     ,0x2d6,"Unable to seek to position in dmp file");
      exit(1);
    }
    if (n_frame == (uint32 **)0x0) {
      buf._4_4_ = 1;
    }
    else {
      buf._4_4_ = n_frame[id][uVar1];
    }
    buf_00 = __ckd_malloc__((ulong)(buf._4_4_ * frame_sz),
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                            ,0x2e1);
    iVar4 = bio_fread(buf_00,1,frame_sz * buf._4_4_,(FILE *)__stream,dmp_swp[id_part[id]],&ignore);
    if (iVar4 != frame_sz * buf._4_4_) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                     ,0x2e5,"Unable to read segment from dmp file");
      exit(1);
    }
    lVar6 = ftell(__stream);
    id_nxt_off[id] = (uint32)lVar6;
    pppfVar7 = (vector_t **)
               __ckd_calloc_2d__((ulong)buf._4_4_,(ulong)n_stream,8,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libio/segdmp.c"
                                 ,0x2ea);
    local_54 = 0;
    for (l = 0; l < buf._4_4_; l = l + 1) {
      for (local_50 = 0; local_50 < n_stream; local_50 = local_50 + 1) {
        pppfVar7[l][local_50] = (vector_t)((long)buf_00 + (ulong)local_54 * 4);
        local_54 = vecsize[local_50] + local_54;
      }
    }
    *out_feat = pppfVar7;
    *out_n_frame = buf._4_4_;
    out_feat_local._4_4_ = 1;
  }
  return out_feat_local._4_4_;
}

Assistant:

int
segdmp_next_feat(uint32 id,
		 vector_t ***out_feat,
		 uint32 *out_n_frame)
{
    FILE *fp;
    uint32 s;
    uint32 off;
    uint32 n_seg_frame;
    float32 *buf;
    vector_t **feat;
    uint32 i, j, l;
    
    fp = dmp_fp[id_part[id]];

    s = nxt_seg[id];
    if (s == n_seg[id]) {
	nxt_seg[id] = 0;

	return 0;
    }
    else {
	++nxt_seg[id];
    }

    off = id_nxt_off[id];
    if (ftell(fp) != off) {
	if (fseek(fp, off, SEEK_SET) < 0) {
	    E_FATAL_SYSTEM("Unable to seek to position in dmp file");
	}
    }

    if (n_frame == NULL) {
	n_seg_frame = 1;
    }
    else {
	n_seg_frame = n_frame[id][s];
    }

    buf = ckd_malloc(n_seg_frame * frame_sz);

    if (bio_fread(buf, sizeof(char), frame_sz * n_seg_frame,
	       fp, dmp_swp[id_part[id]], &ignore) != frame_sz * n_seg_frame) {
	E_FATAL_SYSTEM("Unable to read segment from dmp file");
    }

    id_nxt_off[id] = ftell(fp);

    feat = (vector_t **)ckd_calloc_2d(n_seg_frame, n_stream, sizeof(vector_t));
    for (i = 0, l = 0; i < n_seg_frame; i++) {
	for (j = 0; j < n_stream; j++) {
	    feat[i][j] = &buf[l];
	    
	    l += vecsize[j];
	}
    }

    *out_feat = feat;
    *out_n_frame = n_seg_frame;

    return 1;
}